

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O2

int src_simple(SRC_DATA *src_data,int converter,int channels)

{
  int iVar1;
  undefined8 in_RAX;
  SRC_STATE *state;
  int error;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  state = src_new(converter,channels,(int *)((long)&uStack_18 + 4));
  if (state != (SRC_STATE *)0x0) {
    src_data->end_of_input = 1;
    iVar1 = src_process(state,src_data);
    uStack_18 = CONCAT44(iVar1,(undefined4)uStack_18);
    src_delete(state);
  }
  return uStack_18._4_4_;
}

Assistant:

int
src_simple (SRC_DATA *src_data, int converter, int channels)
{	SRC_STATE	*src_state ;
	int 		error ;

	if ((src_state = src_new (converter, channels, &error)) == NULL)
		return error ;

	src_data->end_of_input = 1 ; /* Only one buffer worth of input. */

	error = src_process (src_state, src_data) ;

	src_delete (src_state) ;

	return error ;
}